

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O2

bool __thiscall QFontDef::operator==(QFontDef *this,QFontDef *other)

{
  compare_eq_result_container<QList<QString>,_QString> cVar1;
  bool bVar2;
  
  if (((this->pixelSize == other->pixelSize) && (!NAN(this->pixelSize) && !NAN(other->pixelSize)))
     && (((*(ulong *)&other->field_0x60 ^ *(ulong *)&this->field_0x60) & 0xfffff3fffffff) == 0)) {
    cVar1 = QList<QString>::operator==(&this->families,&other->families);
    if (cVar1) {
      bVar2 = ::comparesEqual(&this->styleName,&other->styleName);
      if ((bVar2) &&
         (((*(uint *)&other->field_0x60 ^ *(uint *)&this->field_0x60) & 0xc0000000) == 0)) {
        bVar2 = comparesEqual<QFont::Tag,_float,_true>
                          (&this->variableAxisValues,&other->variableAxisValues);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const QFontDef &other) const
    {
        return pixelSize == other.pixelSize
                    && weight == other.weight
                    && style == other.style
                    && stretch == other.stretch
                    && styleHint == other.styleHint
                    && styleStrategy == other.styleStrategy
                    && ignorePitch == other.ignorePitch && fixedPitch == other.fixedPitch
                    && families == other.families
                    && styleName == other.styleName
                    && hintingPreference == other.hintingPreference
                    && variableAxisValues == other.variableAxisValues
                          ;
    }